

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::InternalInitializeCriticalSectionAndSpinCount
               (PCRITICAL_SECTION pCriticalSection,DWORD dwSpinCount,bool fInternal)

{
  BOOL BVar1;
  _CRITICAL_SECTION_DEBUG_INFO *p_Var2;
  CPalThread *local_50;
  PLIST_ENTRY _EX_ListHead_1;
  PLIST_ENTRY _EX_Blink_1;
  PLIST_ENTRY _EX_ListHead;
  PLIST_ENTRY _EX_Blink;
  CPalThread *pThread;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  bool fInternal_local;
  DWORD dwSpinCount_local;
  PCRITICAL_SECTION pCriticalSection_local;
  
  pCriticalSection->DebugInfo = (PVOID)0x0;
  Volatile<int>::operator=((Volatile<int> *)&pCriticalSection->LockCount,0);
  pCriticalSection->RecursionCount = 0;
  pCriticalSection->SpinCount = (ulong)dwSpinCount;
  pCriticalSection->OwningThread = (HANDLE)0x0;
  pCriticalSection->LockSemaphore = (HANDLE)0x0;
  pCriticalSection->bInternal = (uint)fInternal;
  BVar1 = PALIsThreadDataInitialized();
  if (BVar1 == 0) {
    local_50 = (CPalThread *)0x0;
  }
  else {
    local_50 = GetCurrentPalThread();
  }
  p_Var2 = InternalNew<_CRITICAL_SECTION_DEBUG_INFO>();
  pCriticalSection->DebugInfo = p_Var2;
  if (pCriticalSection->DebugInfo == (PVOID)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalInitializeCriticalSectionAndSpinCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x280);
    fprintf(_stderr,
            "Expression: NULL != pPalCriticalSection->DebugInfo, Description: Failed to allocate debug info for new CS\n"
           );
  }
  Volatile<unsigned_int>::operator=
            ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x18),0);
  Volatile<unsigned_int>::operator=
            ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x1c),0);
  Volatile<int>::operator=((Volatile<int> *)((long)pCriticalSection->DebugInfo + 0x20),0);
  *(PCRITICAL_SECTION *)((long)pCriticalSection->DebugInfo + 0x10) = pCriticalSection;
  if (pCriticalSection == (PCRITICAL_SECTION)g_csPALCSsListLock) {
    *(undefined ***)g_csPALCSsListLock._0_8_ = &g_PALCSList;
    *(undefined **)(g_csPALCSsListLock._0_8_ + 8) = PTR_g_PALCSList_001d3860;
    *(undefined8 *)PTR_g_PALCSList_001d3860 = g_csPALCSsListLock._0_8_;
    PTR_g_PALCSList_001d3860 = (undefined *)g_csPALCSsListLock._0_8_;
  }
  else {
    InternalEnterCriticalSection(local_50,(PCRITICAL_SECTION)g_csPALCSsListLock);
    *(undefined ***)pCriticalSection->DebugInfo = &g_PALCSList;
    *(undefined **)((long)pCriticalSection->DebugInfo + 8) = PTR_g_PALCSList_001d3860;
    *(PVOID *)PTR_g_PALCSList_001d3860 = pCriticalSection->DebugInfo;
    PTR_g_PALCSList_001d3860 = (undefined *)pCriticalSection->DebugInfo;
    InternalLeaveCriticalSection(local_50,(PCRITICAL_SECTION)g_csPALCSsListLock);
  }
  Volatile<PalCsInitState>::operator=
            ((Volatile<PalCsInitState> *)&pCriticalSection->dwInitState,PalCsUserInitialized);
  return;
}

Assistant:

void InternalInitializeCriticalSectionAndSpinCount(
        PCRITICAL_SECTION pCriticalSection,
        DWORD dwSpinCount,
        bool fInternal)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

#ifndef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
        // Make sure bits are defined in a usable way
        _ASSERTE(PALCS_LOCK_AWAKENED_WAITER * 2 == PALCS_LOCK_WAITER_INC);
#endif // !PALCS_TRANSFER_OWNERSHIP_ON_RELEASE

        // Make sure structure sizes are compatible
        _ASSERTE(sizeof(CRITICAL_SECTION) >= sizeof(PAL_CRITICAL_SECTION));

#ifdef _DEBUG
        if (sizeof(CRITICAL_SECTION) > sizeof(PAL_CRITICAL_SECTION))
        {
            WARN("PAL_CS_NATIVE_DATA_SIZE appears to be defined to a value (%d) "
                 "larger than needed on this platform (%d).\n",
                 sizeof(CRITICAL_SECTION), sizeof(PAL_CRITICAL_SECTION));
        }
#endif // _DEBUG

        // Init CS data
        pPalCriticalSection->DebugInfo         = NULL;
        pPalCriticalSection->LockCount         = 0;
        pPalCriticalSection->RecursionCount    = 0;
        pPalCriticalSection->SpinCount         = dwSpinCount;
        pPalCriticalSection->OwningThread      = NULL;
        pPalCriticalSection->LockSemaphore     = NULL;
        pPalCriticalSection->fInternal         = fInternal;

#ifdef _DEBUG
        CPalThread * pThread =
            (PALIsThreadDataInitialized() ? GetCurrentPalThread() : NULL);

        pPalCriticalSection->DebugInfo = InternalNew<CRITICAL_SECTION_DEBUG_INFO>();
        _ASSERT_MSG(NULL != pPalCriticalSection->DebugInfo,
                    "Failed to allocate debug info for new CS\n");

        // Init debug info data
        pPalCriticalSection->DebugInfo->lAcquireCount    = 0;
        pPalCriticalSection->DebugInfo->lEnterCount      = 0;
        pPalCriticalSection->DebugInfo->lContentionCount = 0;
        pPalCriticalSection->DebugInfo->pOwnerCS         = pPalCriticalSection;

        // Insert debug info struct in global list
        if (pPalCriticalSection != &g_csPALCSsListLock)
        {
            InternalEnterCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
            InsertTailList(&g_PALCSList, &pPalCriticalSection->DebugInfo->Link);
            InternalLeaveCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
        }
        else
        {
            InsertTailList(&g_PALCSList, &pPalCriticalSection->DebugInfo->Link);
        }

#ifdef PAL_TRACK_CRITICAL_SECTIONS_DATA
        InterlockedIncrement(fInternal ?
            &g_lPALCSInternalInitializeCount : &g_lPALCSInitializeCount);
#endif // PAL_TRACK_CRITICAL_SECTIONS_DATA
#endif // _DEBUG

        // Set initializazion state
        pPalCriticalSection->cisInitState = PalCsUserInitialized;

#ifdef MUTEX_BASED_CSS
        bool fInit;
        do
        {
            fInit = PALCS_FullyInitialize(pPalCriticalSection);
            _ASSERTE(fInit);
        } while (!fInit && 0 == sched_yield());

        if (fInit)
        {
            // Set initializazion state
            pPalCriticalSection->cisInitState = PalCsFullyInitialized;
        }
#endif // MUTEX_BASED_CSS
    }